

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit_percent.cpp
# Opt level: O1

SinkResultType __thiscall
duckdb::PhysicalLimitPercent::Sink
          (PhysicalLimitPercent *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  mutex *this_00;
  GlobalSinkState *pGVar1;
  bool bVar2;
  Expression *pEVar3;
  uint64_t index;
  idx_t iVar4;
  BinderException *pBVar5;
  double dVar6;
  Value val;
  string local_90;
  Value local_70;
  
  pGVar1 = input->global_state;
  if (pGVar1[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[0x20] == '\0')
  {
    pEVar3 = BoundLimitNode::GetPercentageExpression(&this->limit_val);
    PhysicalLimit::GetDelimiter(&local_70,context,chunk,pEVar3);
    if (local_70.is_null == false) {
      dVar6 = Value::GetValue<double>(&local_70);
    }
    else {
      dVar6 = 100.0;
    }
    *(double *)&pGVar1[1].super_StateWithBlockableTasks = dVar6;
    if (dVar6 < 0.0) {
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Percentage value(%f) can\'t be negative","");
      BinderException::BinderException<double>
                (pBVar5,&local_90,*(double *)&pGVar1[1].super_StateWithBlockableTasks);
      __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pGVar1[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[0x20] = '\x01';
    Value::~Value(&local_70);
  }
  this_00 = &pGVar1[1].super_StateWithBlockableTasks.lock;
  if ((this_00->super___mutex_base)._M_mutex.__align == -1) {
    pEVar3 = BoundLimitNode::GetValueExpression(&this->offset_val);
    PhysicalLimit::GetDelimiter(&local_70,context,chunk,pEVar3);
    if (local_70.is_null == false) {
      index = Value::GetValue<unsigned_long>(&local_70);
      optional_idx::optional_idx((optional_idx *)&local_90,index);
      (this_00->super___mutex_base)._M_mutex.__align = (long)local_90._M_dataplus._M_p;
    }
    else {
      (this_00->super___mutex_base)._M_mutex.__align = 0;
    }
    iVar4 = optional_idx::GetIndex((optional_idx *)this_00);
    if (0x4000000000000000 < iVar4) {
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Max value %lld for LIMIT/OFFSET is %lld","");
      iVar4 = optional_idx::GetIndex((optional_idx *)this_00);
      BinderException::BinderException<unsigned_long,unsigned_long_long>
                (pBVar5,&local_90,iVar4,0x4000000000000000);
      __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::~Value(&local_70);
  }
  iVar4 = optional_idx::GetIndex((optional_idx *)this_00);
  bVar2 = PhysicalLimit::HandleOffset(chunk,(idx_t *)(pGVar1 + 1),iVar4,0xffffffffffffffff);
  if (bVar2) {
    ColumnDataCollection::Append
              ((ColumnDataCollection *)
               ((long)&pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8)
               ,chunk);
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalLimitPercent::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	D_ASSERT(chunk.size() > 0);
	auto &state = input.global_state.Cast<LimitPercentGlobalState>();
	auto &limit_percent = state.limit_percent;
	auto &offset = state.offset;

	// get the next chunk from the child
	if (!state.is_limit_set) {
		Value val = PhysicalLimit::GetDelimiter(context, chunk, limit_val.GetPercentageExpression());
		if (!val.IsNull()) {
			limit_percent = val.GetValue<double>();
		} else {
			limit_percent = 100.0;
		}
		if (limit_percent < 0.0) {
			throw BinderException("Percentage value(%f) can't be negative", limit_percent);
		}
		state.is_limit_set = true;
	}
	if (!state.offset.IsValid()) {
		Value val = PhysicalLimit::GetDelimiter(context, chunk, offset_val.GetValueExpression());
		if (!val.IsNull()) {
			offset = val.GetValue<idx_t>();
		} else {
			offset = 0;
		}
		if (offset.GetIndex() > 1ULL << 62ULL) {
			throw BinderException("Max value %lld for LIMIT/OFFSET is %lld", offset.GetIndex(), 1ULL << 62ULL);
		}
	}

	if (!PhysicalLimit::HandleOffset(chunk, state.current_offset, offset.GetIndex(), NumericLimits<idx_t>::Maximum())) {
		return SinkResultType::NEED_MORE_INPUT;
	}

	state.data.Append(chunk);
	return SinkResultType::NEED_MORE_INPUT;
}